

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O3

void Rwr_Trav_rec(Rwr_Man_t *p,Rwr_Node_t *pNode,int *pVolume)

{
  int iVar1;
  int *piVar2;
  
  if ((pNode->field_0x11 & 0x40) == 0) {
    piVar2 = (int *)&pNode->field_0xe;
    do {
      if (pNode->TravId == p->nTravIds) {
        return;
      }
      pNode->TravId = p->nTravIds;
      iVar1 = *pVolume;
      *pVolume = iVar1 + 1;
      if (*piVar2 < 0) {
        *pVolume = iVar1 + 2;
      }
      Rwr_Trav_rec(p,(Rwr_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe),pVolume);
      pNode = (Rwr_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe);
      piVar2 = (int *)&pNode->field_0xe;
    } while ((pNode->field_0x11 & 0x40) == 0);
  }
  return;
}

Assistant:

void Rwr_Trav_rec( Rwr_Man_t * p, Rwr_Node_t * pNode, int * pVolume )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    (*pVolume)++;
    if ( pNode->fExor )
        (*pVolume)++;
    Rwr_Trav_rec( p, Rwr_Regular(pNode->p0), pVolume );
    Rwr_Trav_rec( p, Rwr_Regular(pNode->p1), pVolume );
}